

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_message_handler.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
lscpp::lsp_message_handler::handle_message
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,lsp_message_handler *this,lsp_server *server,string *request)

{
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  reference pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  DidSaveTextDocumentParams local_678;
  undefined1 local_630 [8];
  DidSaveTextDocumentParams params_6;
  undefined1 local_5c8 [8];
  DidCloseTextDocumentParams params_5;
  undefined1 local_568 [8];
  DidChangeTextDocumentParams params_4;
  undefined1 local_4c0 [8];
  DidOpenTextDocumentParams params_3;
  undefined1 local_438 [8];
  json json_result_4;
  undefined1 local_400 [8];
  Location result_2;
  TextDocumentPositionParams params_2;
  undefined1 local_388 [8];
  json json_result_3;
  undefined1 local_350 [8];
  variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
  result_1;
  CompletionParams params_1;
  undefined1 local_2e8 [8];
  json json_result_2;
  undefined1 local_2b0 [8];
  Hover result;
  TextDocumentPositionParams params;
  undefined1 local_230 [8];
  json json_result_1;
  json j_null;
  string local_208;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e8;
  string_t local_1d8;
  undefined4 local_1b4;
  string_t local_1b0;
  undefined1 local_190 [8];
  json json_result;
  InitializeResult init_result;
  InitializeParams init_params;
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_58;
  undefined1 local_38 [8];
  json j;
  string *request_local;
  lsp_server *server_local;
  lsp_message_handler *this_local;
  
  j.m_value = (json_value)request;
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_58,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_38,request,&local_58,true,false);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_58);
  if ((this->initialized_ & 1U) == 0) {
    pvVar4 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_38,"method");
    bVar1 = nlohmann::json_abi_v3_11_2::operator!=<const_char_*,_0>(pvVar4,"initialize");
    if (bVar1) {
      VVar2 = loguru::current_verbosity_cutoff();
      if (-1 < VVar2) {
        loguru::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      }
      exit(1);
    }
    this->initialized_ = true;
    pvVar4 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_38,"params");
    anon_unknown_3::parse_initialize_params
              ((InitializeParams *)
               &init_result.capabilities.diagnosticProvider.
                super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
                super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
                super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged,pvVar4);
    (**server->_vptr_lsp_server)
              (&json_result.m_value,server,
               &init_result.capabilities.diagnosticProvider.
                super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
                super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
                super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged);
    pvVar4 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_38,"id");
    iVar3 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_int<int,_0>(pvVar4);
    anon_unknown_3::make_response_message<lscpp::protocol::InitializeResult>
              ((anon_unknown_3 *)local_190,iVar3,(InitializeResult *)&json_result.m_value);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_1b0,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_190,-1,' ',false,strict);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    local_1b4 = 1;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_190);
    protocol::InitializeResult::~InitializeResult((InitializeResult *)&json_result.m_value);
    protocol::InitializeParams::~InitializeParams
              ((InitializeParams *)
               &init_result.capabilities.diagnosticProvider.
                super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
                super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
                super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged);
  }
  else if ((this->ready_ & 1U) == 0) {
    pvVar4 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_38,"method");
    bVar1 = nlohmann::json_abi_v3_11_2::operator!=<const_char_*,_0>(pvVar4,"initialized");
    if (bVar1) {
      VVar2 = loguru::current_verbosity_cutoff();
      if (-1 < VVar2) {
        loguru::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      }
      exit(1);
    }
    this->ready_ = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"I got initialized!",
               (allocator<char> *)((long)&j_null.m_value + 7));
    anon_unknown_3::make_notification_message((anon_unknown_3 *)&local_1e8,&local_208);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_1d8,&local_1e8,-1,' ',false,strict);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)((long)&j_null.m_value + 7));
    local_1b4 = 1;
  }
  else {
    if ((this->shutdown_ & 1U) != 0) {
      pvVar4 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_38,"method");
      bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>(pvVar4,"exit");
      if (bVar1) {
        exit(0);
      }
      exit(1);
    }
    pvVar4 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_38,"method");
    bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>(pvVar4,"shutdown");
    if (bVar1) {
      this->shutdown_ = true;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&json_result_1.m_value,(nullptr_t)0x0);
      pvVar4 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_38,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator_int<int,_0>(pvVar4);
      (anonymous_namespace)::
      make_response_message<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((_anonymous_namespace_ *)local_230,iVar3,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&json_result_1.m_value);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump((string_t *)&params.position,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_230,-1,' ',false,strict);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &params.position);
      std::__cxx11::string::~string((string *)&params.position);
      local_1b4 = 1;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_230);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&json_result_1.m_value);
    }
    else {
      pvVar4 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_38,"method");
      bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>(pvVar4,"textDocument/hover");
      if (bVar1) {
        VVar2 = loguru::current_verbosity_cutoff();
        if (-1 < VVar2) {
          loguru::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        }
        protocol::TextDocumentPositionParams::TextDocumentPositionParams
                  ((TextDocumentPositionParams *)
                   &result.range.super__Optional_base<lscpp::protocol::Range,_true,_true>._M_payload
                    .super__Optional_payload_base<lscpp::protocol::Range>._M_engaged);
        pvVar4 = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::at<const_char_(&)[7],_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_38,(char (*) [7])"params");
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::get_to<lscpp::protocol::TextDocumentPositionParams,_0>
                  (pvVar4,(TextDocumentPositionParams *)
                          &result.range.super__Optional_base<lscpp::protocol::Range,_true,_true>.
                           _M_payload.super__Optional_payload_base<lscpp::protocol::Range>.
                           _M_engaged);
        iVar3 = (*server->_vptr_lsp_server[1])();
        protocol::TextDocumentPositionParams::TextDocumentPositionParams
                  ((TextDocumentPositionParams *)&json_result_2.m_value,
                   (TextDocumentPositionParams *)
                   &result.range.super__Optional_base<lscpp::protocol::Range,_true,_true>._M_payload
                    .super__Optional_payload_base<lscpp::protocol::Range>._M_engaged);
        (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
                  (local_2b0,(undefined8 *)CONCAT44(extraout_var,iVar3),&json_result_2.m_value);
        protocol::TextDocumentPositionParams::~TextDocumentPositionParams
                  ((TextDocumentPositionParams *)&json_result_2.m_value);
        pvVar4 = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_38,"id");
        iVar3 = nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator_int<int,_0>(pvVar4);
        anon_unknown_3::make_response_message<lscpp::protocol::Hover>
                  ((anon_unknown_3 *)local_2e8,iVar3,(Hover *)local_2b0);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump((string_t *)&params_1.super_TextDocumentPositionParams.position,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_2e8,-1,' ',false,strict);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &params_1.super_TextDocumentPositionParams.position);
        std::__cxx11::string::~string((string *)&params_1.super_TextDocumentPositionParams.position)
        ;
        local_1b4 = 1;
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_2e8);
        protocol::Hover::~Hover((Hover *)local_2b0);
        protocol::TextDocumentPositionParams::~TextDocumentPositionParams
                  ((TextDocumentPositionParams *)
                   &result.range.super__Optional_base<lscpp::protocol::Range,_true,_true>._M_payload
                    .super__Optional_payload_base<lscpp::protocol::Range>._M_engaged);
      }
      else {
        pvVar4 = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_38,"method");
        bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                          (pvVar4,"textDocument/completion");
        if (bVar1) {
          VVar2 = loguru::current_verbosity_cutoff();
          if (-1 < VVar2) {
            loguru::log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          }
          std::__cxx11::string::string
                    ((string *)
                     &result_1.
                      super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                      .super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      _M_index);
          params_1.super_TextDocumentPositionParams.textDocument.uri.field_2._8_4_ = 0;
          params_1.super_TextDocumentPositionParams.textDocument.uri.field_2._12_4_ = 0;
          pvVar4 = nlohmann::json_abi_v3_11_2::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at<const_char_(&)[7],_0>
                             ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)local_38,(char (*) [7])"params");
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_to<lscpp::protocol::CompletionParams,_0>
                    (pvVar4,(CompletionParams *)
                            &result_1.
                             super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                             .
                             super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>
                             .
                             super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>
                             .super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                             super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                             super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>
                             ._M_index);
          iVar3 = (*server->_vptr_lsp_server[1])();
          protocol::CompletionParams::CompletionParams
                    ((CompletionParams *)&json_result_3.m_value,
                     (CompletionParams *)
                     &result_1.
                      super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                      .super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      _M_index);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
                    (local_350,(long *)CONCAT44(extraout_var_00,iVar3),&json_result_3.m_value);
          protocol::CompletionParams::~CompletionParams((CompletionParams *)&json_result_3.m_value);
          pvVar4 = nlohmann::json_abi_v3_11_2::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_38,"id");
          iVar3 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_int<int,_0>(pvVar4);
          (anonymous_namespace)::
          make_response_message<std::variant<std::vector<lscpp::protocol::CompletionItem,std::allocator<lscpp::protocol::CompletionItem>>>>
                    ((_anonymous_namespace_ *)local_388,iVar3,
                     (variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                      *)local_350);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump((string_t *)&params_2.position,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_388,-1,' ',false,strict);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &params_2.position);
          std::__cxx11::string::~string((string *)&params_2.position);
          local_1b4 = 1;
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_388);
          std::
          variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
          ::~variant((variant<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                      *)local_350);
          protocol::CompletionParams::~CompletionParams
                    ((CompletionParams *)
                     &result_1.
                      super__Variant_base<std::vector<lscpp::protocol::CompletionItem,_std::allocator<lscpp::protocol::CompletionItem>_>_>
                      .super__Move_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_assign_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Move_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Copy_ctor_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      super__Variant_storage_alias<std::vector<lscpp::protocol::CompletionItem>_>.
                      _M_index);
        }
        else {
          pvVar4 = nlohmann::json_abi_v3_11_2::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_38,"method");
          bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                            (pvVar4,"textDocument/definition");
          if (bVar1) {
            VVar2 = loguru::current_verbosity_cutoff();
            if (-1 < VVar2) {
              loguru::log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            }
            std::__cxx11::string::string((string *)&result_2.range.end);
            params_2.textDocument.uri.field_2._8_4_ = 0;
            params_2.textDocument.uri.field_2._12_4_ = 0;
            pvVar4 = nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::at<const_char_(&)[7],_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)local_38,(char (*) [7])"params");
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_to<lscpp::protocol::TextDocumentPositionParams,_0>
                      (pvVar4,(TextDocumentPositionParams *)&result_2.range.end);
            iVar3 = (*server->_vptr_lsp_server[1])();
            protocol::TextDocumentPositionParams::TextDocumentPositionParams
                      ((TextDocumentPositionParams *)&json_result_4.m_value,
                       (TextDocumentPositionParams *)&result_2.range.end);
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 8))
                      (local_400,(long *)CONCAT44(extraout_var_01,iVar3),&json_result_4.m_value);
            protocol::TextDocumentPositionParams::~TextDocumentPositionParams
                      ((TextDocumentPositionParams *)&json_result_4.m_value);
            pvVar4 = nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)local_38,"id");
            iVar3 = nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_int<int,_0>(pvVar4);
            anon_unknown_3::make_response_message<lscpp::protocol::Location>
                      ((anon_unknown_3 *)local_438,iVar3,(Location *)local_400);
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump((string_t *)((long)&params_3.textDocument.text.field_2 + 8),
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_438,-1,' ',false,strict);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&params_3.textDocument.text.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)(params_3.textDocument.text.field_2._M_local_buf + 8));
            local_1b4 = 1;
            nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)local_438);
            protocol::Location::~Location((Location *)local_400);
            protocol::TextDocumentPositionParams::~TextDocumentPositionParams
                      ((TextDocumentPositionParams *)&result_2.range.end);
          }
          else {
            pvVar4 = nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)local_38,"method");
            bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                              (pvVar4,"textDocument/didOpen");
            if (bVar1) {
              VVar2 = loguru::current_verbosity_cutoff();
              if (-1 < VVar2) {
                loguru::log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
              }
              std::__cxx11::string::string((string *)local_4c0);
              std::__cxx11::string::string
                        ((string *)(params_3.textDocument.uri.field_2._M_local_buf + 8));
              params_3.textDocument.languageId.field_2._8_4_ = 0;
              std::__cxx11::string::string((string *)&params_3.textDocument.version);
              pvVar4 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::at<const_char_(&)[7],_0>
                                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)local_38,(char (*) [7])"params");
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_to<lscpp::protocol::DidOpenTextDocumentParams,_0>
                        (pvVar4,(DidOpenTextDocumentParams *)local_4c0);
              iVar3 = (*server->_vptr_lsp_server[1])();
              protocol::DidOpenTextDocumentParams::DidOpenTextDocumentParams
                        ((DidOpenTextDocumentParams *)
                         &params_4.contentChanges.
                          super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (DidOpenTextDocumentParams *)local_4c0);
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x18))
                        ((long *)CONCAT44(extraout_var_02,iVar3),
                         &params_4.contentChanges.
                          super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              protocol::DidOpenTextDocumentParams::~DidOpenTextDocumentParams
                        ((DidOpenTextDocumentParams *)
                         &params_4.contentChanges.
                          super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              protocol::DidOpenTextDocumentParams::~DidOpenTextDocumentParams
                        ((DidOpenTextDocumentParams *)local_4c0);
            }
            else {
              pvVar4 = nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)local_38,"method");
              bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                                (pvVar4,"textDocument/didChange");
              if (bVar1) {
                VVar2 = loguru::current_verbosity_cutoff();
                if (-1 < VVar2) {
                  loguru::log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
                }
                std::__cxx11::string::string((string *)local_568);
                params_4.textDocument.super_TextDocumentIdentifier.uri.field_2._8_4_ = 0;
                params_4.textDocument.version = 0;
                params_4.textDocument._36_4_ = 0;
                params_4.contentChanges.
                super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                params_4.contentChanges.
                super__Vector_base<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::
                vector<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                ::vector((vector<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
                          *)&params_4.textDocument.version);
                pvVar4 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::at<const_char_(&)[7],_0>
                                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)local_38,(char (*) [7])"params");
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_to<lscpp::protocol::DidChangeTextDocumentParams,_0>
                          (pvVar4,(DidChangeTextDocumentParams *)local_568);
                iVar3 = (*server->_vptr_lsp_server[1])();
                protocol::DidChangeTextDocumentParams::DidChangeTextDocumentParams
                          ((DidChangeTextDocumentParams *)
                           ((long)&params_5.textDocument.uri.field_2 + 8),
                           (DidChangeTextDocumentParams *)local_568);
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x20))
                          ((long *)CONCAT44(extraout_var_03,iVar3),
                           (undefined1 *)((long)&params_5.textDocument.uri.field_2 + 8));
                protocol::DidChangeTextDocumentParams::~DidChangeTextDocumentParams
                          ((DidChangeTextDocumentParams *)
                           ((long)&params_5.textDocument.uri.field_2 + 8));
                protocol::DidChangeTextDocumentParams::~DidChangeTextDocumentParams
                          ((DidChangeTextDocumentParams *)local_568);
              }
              else {
                pvVar4 = nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)local_38,"method");
                bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                                  (pvVar4,"textDocument/didClose");
                if (bVar1) {
                  VVar2 = loguru::current_verbosity_cutoff();
                  if (-1 < VVar2) {
                    loguru::log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
                  }
                  std::__cxx11::string::string((string *)local_5c8);
                  pvVar4 = nlohmann::json_abi_v3_11_2::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::at<const_char_(&)[7],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)local_38,(char (*) [7])"params");
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_to<lscpp::protocol::DidCloseTextDocumentParams,_0>
                            (pvVar4,(DidCloseTextDocumentParams *)local_5c8);
                  iVar3 = (*server->_vptr_lsp_server[1])();
                  protocol::DidCloseTextDocumentParams::DidCloseTextDocumentParams
                            ((DidCloseTextDocumentParams *)
                             &params_6.text.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged,(DidCloseTextDocumentParams *)local_5c8);
                  (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x28))
                            ((long *)CONCAT44(extraout_var_04,iVar3),
                             &params_6.text.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
                  protocol::DidCloseTextDocumentParams::~DidCloseTextDocumentParams
                            ((DidCloseTextDocumentParams *)
                             &params_6.text.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
                  protocol::DidCloseTextDocumentParams::~DidCloseTextDocumentParams
                            ((DidCloseTextDocumentParams *)local_5c8);
                }
                else {
                  pvVar4 = nlohmann::json_abi_v3_11_2::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                       *)local_38,"method");
                  bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                                    (pvVar4,"textDocument/didSave");
                  if (bVar1) {
                    VVar2 = loguru::current_verbosity_cutoff();
                    if (-1 < VVar2) {
                      loguru::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
                    }
                    std::__cxx11::string::string((string *)local_630);
                    std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&params_6.textDocument.uri.field_2 + 8));
                    pvVar4 = nlohmann::json_abi_v3_11_2::
                             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::at<const_char_(&)[7],_0>
                                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)local_38,(char (*) [7])"params");
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get_to<lscpp::protocol::DidSaveTextDocumentParams,_0>
                              (pvVar4,(DidSaveTextDocumentParams *)local_630);
                    iVar3 = (*server->_vptr_lsp_server[1])();
                    protocol::DidSaveTextDocumentParams::DidSaveTextDocumentParams
                              (&local_678,(DidSaveTextDocumentParams *)local_630);
                    (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x30))
                              ((long *)CONCAT44(extraout_var_05,iVar3),&local_678);
                    protocol::DidSaveTextDocumentParams::~DidSaveTextDocumentParams(&local_678);
                    protocol::DidSaveTextDocumentParams::~DidSaveTextDocumentParams
                              ((DidSaveTextDocumentParams *)local_630);
                  }
                  else {
                    pvVar4 = nlohmann::json_abi_v3_11_2::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                         *)local_38,"method");
                    bVar1 = nlohmann::json_abi_v3_11_2::operator==<const_char_*,_0>
                                      (pvVar4,"textDocument/willSave");
                    if ((bVar1) && (VVar2 = loguru::current_verbosity_cutoff(), -1 < VVar2)) {
                      loguru::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
                    }
                  }
                }
              }
            }
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional(__return_storage_ptr__);
            local_1b4 = 1;
          }
        }
      }
    }
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
lsp_message_handler::handle_message(lsp_server &server,
                                    std::string const &request) {
  nlohmann::json j = nlohmann::json::parse(request);

  if (!initialized_) {
    if (j["method"] != "initialize") {
      LOG_F(INFO, "Expected initialize request");
      exit(1);
    } else {
      initialized_ = true;
      auto init_params = parse_initialize_params(j["params"]);
      auto init_result = server.initialize(init_params);
      // nlohmann::json json_result = init_result.json();
      auto json_result = make_response_message(j["id"], init_result);
      return json_result.dump();
    }
  } else if (!ready_) {
    if (j["method"] != "initialized") {
      LOG_F(INFO, "Expected initialized request");
      exit(1);
    } else {
      ready_ = true;
      return make_notification_message("I got initialized!").dump();
      // auto init_params = parse_initialize_params(j["params"]);
      // auto init_result = server_.initialize(init_params);
      // // nlohmann::json json_result = init_result.json();
      // auto json_result = make_response_message(j["id"], init_result);
      // return json_result.dump();
    }
  } else if (shutdown_) {
    if (j["method"] == "exit") {
      exit(0); // TODO give the user the chance to do something, i.e. call a
               // virtual method
    } else {
      // TODO: send invalid request
      exit(1);
    }
  } else {
    if (j["method"] == "shutdown") {
      shutdown_ = true;
      nlohmann::json j_null;
      auto json_result = make_response_message(j["id"], j_null);
      return json_result.dump();
    } else if (j["method"] == "textDocument/hover") {
      LOG_F(INFO, "Received textDocument/hover");
      protocol::TextDocumentPositionParams params;
      j.at("params").get_to(params);
      auto result = server.getTextDocumentService().hover(params);
      auto json_result = make_response_message(j["id"], result);
      return json_result.dump();
    } else if (j["method"] == "textDocument/completion") {
      LOG_F(INFO, "Received textDocument/completion");
      protocol::CompletionParams params{};
      j.at("params").get_to(params);
      auto result = server.getTextDocumentService().completion(params);
      auto json_result = make_response_message(j["id"], result);
      return json_result.dump();
    } else if (j["method"] == "textDocument/definition") {
      LOG_F(INFO, "Received textDocument/definition");
      protocol::TextDocumentPositionParams params{};
      j.at("params").get_to(params);
      auto result = server.getTextDocumentService().definition(params);
      auto json_result = make_response_message(j["id"], result);
      return json_result.dump();
    } else if (j["method"] == "textDocument/didOpen") {
      LOG_F(INFO, "Received textDocument/didOpen");
      protocol::DidOpenTextDocumentParams params{};
      j.at("params").get_to(params);
      server.getTextDocumentService().didOpen(params);
    } else if (j["method"] == "textDocument/didChange") {
      LOG_F(INFO, "Received textDocument/didChange");
      protocol::DidChangeTextDocumentParams params{};
      j.at("params").get_to(params);
      server.getTextDocumentService().didChange(params);
    } else if (j["method"] == "textDocument/didClose") {
      LOG_F(INFO, "Received textDocument/didClose");
      protocol::DidCloseTextDocumentParams params{};
      j.at("params").get_to(params);
      server.getTextDocumentService().didClose(params);
    } else if (j["method"] == "textDocument/didSave") {
      LOG_F(INFO, "Received textDocument/didSave");
      protocol::DidSaveTextDocumentParams params{};
      j.at("params").get_to(params);
      server.getTextDocumentService().didSave(params);
    } else if (j["method"] == "textDocument/willSave") {
      LOG_F(INFO, "Received textDocument/willSave");
    }
  }
  return std::nullopt;
}